

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::MaybeTripleQuotedString(AsciiParser *this,StringData *str)

{
  ulong uVar1;
  StreamReader *pSVar2;
  char *pcVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint64_t *puVar8;
  undefined4 uVar9;
  ulong uVar10;
  bool bVar11;
  int local_3d4;
  value_type local_3cd;
  int local_3cc;
  allocator_type local_3c5;
  undefined4 local_3c4;
  int local_3c0;
  int local_3bc;
  string s;
  vector<char,_std::allocator<char>_> triple_quote;
  char c;
  Cursor local_358;
  undefined8 uStack_350;
  stringstream str_buf;
  ostream local_330 [376];
  stringstream ss;
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  uVar1 = this->_sr->idx_;
  local_358 = this->_curr_cursor;
  uStack_350 = 0;
  triple_quote.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  triple_quote.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  triple_quote.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar5 = CharN(this,3,&triple_quote);
  if ((bVar5) &&
     ((long)triple_quote.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)triple_quote.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start == 3)) {
    if (*triple_quote.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start == '\'') {
      if ((triple_quote.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start[1] != '\'') ||
         (uVar9 = 1,
         triple_quote.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start[2] != '\'')) goto LAB_0028a145;
    }
    else {
      if ((*triple_quote.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != '\"') ||
         ((triple_quote.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start[1] != '\"' ||
          (triple_quote.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start[2] != '\"')))) goto LAB_0028a145;
      uVar9 = 0;
    }
    local_3c4 = uVar9;
    ::std::__cxx11::stringstream::stringstream((stringstream *)&str_buf);
    local_3cc = (this->_curr_cursor).row;
    local_3bc = 0;
    local_3c0 = 0;
    local_3d4 = (this->_curr_cursor).col;
    do {
      while( true ) {
        bVar5 = Eof(this);
        if ((bVar5) || (bVar5 = Char1(this,&c), !bVar5)) {
          if (uVar1 <= this->_sr->length_) {
            this->_sr->idx_ = uVar1;
          }
          goto LAB_0028a18c;
        }
        if (c == '\\') break;
LAB_0028a05d:
        ::std::operator<<(local_330,c);
        if (c == '\"') {
          if (local_3c0 + 1 == 3 && local_3c4._0_1_ == false) {
LAB_0028a19d:
            local_3d4 = local_3d4 + 1;
            str->single_quote = local_3c4._0_1_;
            ::std::__cxx11::stringbuf::str();
            if (3 < s._M_string_length) {
              ::std::__cxx11::string::erase((ulong)&s,s._M_string_length - 3);
            }
            unescapeControlSequence((string *)&c,&s);
            ::std::__cxx11::string::operator=((string *)str,(string *)&c);
            ::std::__cxx11::string::_M_dispose();
            str->line_row = local_358.row;
            str->line_col = local_358.col;
            str->is_triple_quoted = true;
            (this->_curr_cursor).row = local_3cc;
            (this->_curr_cursor).col = local_3d4;
            ::std::__cxx11::string::_M_dispose();
            bVar5 = true;
            goto LAB_0028a18e;
          }
          local_3bc = 0;
          local_3d4 = local_3d4 + 1;
          local_3c0 = local_3c0 + 1;
        }
        else {
          if (c == '\'') {
            iVar7 = local_3bc + 1;
            iVar4 = local_3d4 + 1;
            if (iVar7 == 3) goto LAB_0028a19d;
          }
          else {
            if (c == '\r') {
              if (this->_sr->idx_ < this->_sr->length_ - 1) {
                bVar5 = Char1(this,(char *)&s);
                if (!bVar5) {
                  if (uVar1 <= this->_sr->length_) {
                    puVar8 = &this->_sr->idx_;
LAB_0028a248:
                    *puVar8 = uVar1;
                  }
                  goto LAB_0028a18c;
                }
                if ((char)s._M_dataplus._M_p == '\n') {
                  ::std::operator<<(local_330,'\n');
                }
                else {
                  pSVar2 = this->_sr;
                  puVar8 = &pSVar2->idx_;
                  if (((long)pSVar2->idx_ < 1) ||
                     (uVar10 = pSVar2->idx_ - 1, pSVar2->length_ < uVar10)) {
                    if (uVar1 <= pSVar2->length_) goto LAB_0028a248;
                    goto LAB_0028a18c;
                  }
                  *puVar8 = uVar10;
                }
              }
LAB_0028a128:
              local_3cc = local_3cc + 1;
              local_3d4 = 0;
            }
            else {
              if (c == '\n') goto LAB_0028a128;
              local_3d4 = local_3d4 + 1;
            }
            iVar7 = 0;
            iVar4 = local_3d4;
          }
          local_3d4 = iVar4;
          local_3c0 = 0;
          local_3bc = iVar7;
        }
      }
      local_3cd = '\0';
      ::std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&s,3,&local_3cd,&local_3c5);
      bVar6 = LookCharN(this,3,(vector<char,_std::allocator<char>_> *)&s);
      bVar11 = false;
      bVar5 = false;
      if (bVar6) {
        pcVar3 = (char *)CONCAT71(s._M_dataplus._M_p._1_7_,(char)s._M_dataplus._M_p);
        bVar6 = true;
        if (*pcVar3 == '\"') {
          if ((pcVar3[1] == '\"') && (pcVar3[2] == '\"')) {
            pcVar3 = "\\\"\"\"";
            goto LAB_0028a02e;
          }
        }
        else {
          bVar5 = bVar11;
          if (((*pcVar3 == '\'') && (pcVar3[1] == '\'')) && (pcVar3[2] == '\'')) {
            pcVar3 = "\\\'\'\'";
LAB_0028a02e:
            ::std::operator<<(local_330,pcVar3 + 1);
            pSVar2 = this->_sr;
            if ((-4 < (long)pSVar2->idx_) && (uVar10 = pSVar2->idx_ + 3, uVar10 <= pSVar2->length_))
            {
              pSVar2->idx_ = uVar10;
            }
            local_3d4 = local_3d4 + 3;
            bVar5 = false;
            goto LAB_00289ff5;
          }
        }
      }
      else {
        bVar5 = true;
LAB_00289ff5:
        bVar6 = false;
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&s);
      if (bVar6) goto LAB_0028a05d;
    } while (!bVar5);
LAB_0028a18c:
    bVar5 = false;
LAB_0028a18e:
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&str_buf);
  }
  else {
LAB_0028a145:
    if (uVar1 <= this->_sr->length_) {
      this->_sr->idx_ = uVar1;
    }
    bVar5 = false;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&triple_quote);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return bVar5;
}

Assistant:

bool AsciiParser::MaybeTripleQuotedString(value::StringData *str) {
  std::stringstream ss;

  auto loc = CurrLoc();
  auto start_cursor = _curr_cursor;

  std::vector<char> triple_quote;
  if (!CharN(3, &triple_quote)) {
    SeekTo(loc);
    return false;
  }

  if (triple_quote.size() != 3) {
    SeekTo(loc);
    return false;
  }

  bool single_quote = false;

  if (triple_quote[0] == '"' && triple_quote[1] == '"' &&
      triple_quote[2] == '"') {
    // ok
  } else if (triple_quote[0] == '\'' && triple_quote[1] == '\'' &&
             triple_quote[2] == '\'') {
    // ok
    single_quote = true;
  } else {
    SeekTo(loc);
    return false;
  }

  // Read until next triple-quote `"""` or "'''"
  std::stringstream str_buf;

  auto locinfo = _curr_cursor;

  int single_quote_count = 0;  // '
  int double_quote_count = 0;  // "

  bool got_closing_triple_quote{false};

  while (!Eof()) {
    char c;

    if (!Char1(&c)) {
      SeekTo(loc);
      return false;
    }

    // Seek \""" or \'''
    // Unescape '\'
    if (c == '\\') {
      std::vector<char> buf(3, '\0');
      if (!LookCharN(3, &buf)) {
        // at least 3 chars should be read
        return false;
      }

      if (buf[0] == '\'' && buf[1] == '\'' && buf[2] == '\'') {
        str_buf << "'''";
        // advance
        _sr->seek_from_current(3);
        locinfo.col += 3;
        continue;
      } else if (buf[0] == '"' && buf[1] == '"' && buf[2] == '"') {
        str_buf << "\"\"\"";
        // advance
        _sr->seek_from_current(3);
        locinfo.col += 3;
        continue;
      }
    }

    str_buf << c;

    if (c == '"') {
      double_quote_count++;
      single_quote_count = 0;
    } else if (c == '\'') {
      double_quote_count = 0;
      single_quote_count++;
    } else {
      double_quote_count = 0;
      single_quote_count = 0;
    }

    // Update loc info
    locinfo.col++;
    if (c == '\n') {
      locinfo.col = 0;
      locinfo.row++;
    } else if (c == '\r') {
      // CRLF?
      if (_sr->tell() < (_sr->size() - 1)) {
        char d;
        if (!Char1(&d)) {
          // this should not happen.
          SeekTo(loc);
          return false;
        }

        if (d == '\n') {
          // CRLF
          str_buf << d;
        } else {
          // unwind 1 char
          if (!_sr->seek_from_current(-1)) {
            // this should not happen.
            SeekTo(loc);
            return false;
          }
        }
      }
      locinfo.col = 0;
      locinfo.row++;
    }

    if (double_quote_count == 3) {
      // got '"""'
      if (single_quote) {
        // continue
      } else {
        got_closing_triple_quote = true;
        break;
      }
    }
    if (single_quote_count == 3) {
      // got '''
      if (double_quote_count) {
        // continue
      } else {
        got_closing_triple_quote = true;
        break;
      }
    }
  }

  if (!got_closing_triple_quote) {
    SeekTo(loc);
    return false;
  }

  DCOUT("single_quote = " << single_quote);
  DCOUT("Triple quoted string found. col " << start_cursor.col << ", row "
                                           << start_cursor.row);

  // remove last '"""' or '''
  str->single_quote = single_quote;
  std::string s = str_buf.str();
  if (s.size() > 3) {  // just in case
    s.erase(s.size() - 3);
  }

  DCOUT("str = " << s);

  str->value = unescapeControlSequence(s);

  DCOUT("unescape str = " << str->value);

  str->line_col = start_cursor.col;
  str->line_row = start_cursor.row;
  str->is_triple_quoted = true;

  _curr_cursor = locinfo;

  return true;
}